

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O3

void __thiscall
ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test::
TestBody(ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test
         *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  AssertHelper local_48;
  Message local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  
  local_40.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_30,"0","sut.invariantWasCalled",(int *)&local_40,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_40);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x5e,message);
    testing::internal::AssertHelper::operator=(&local_50,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_40.ss_.ptr_._4_4_,(uint)local_40.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,(uint)local_40.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,(uint)local_40.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = (this->super_ContractTestOnClassWithInvariant).sut.preConditionWasCalled;
  local_40.ss_.ptr_._0_4_ = CONCAT31(local_40.ss_.ptr_._1_3_,bVar1) ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == true) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_40,(AssertionResult *)"sut.preConditionWasCalled","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x5f,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled == 0;
  local_40.ss_.ptr_._0_4_ = CONCAT31(local_40.ss_.ptr_._1_3_,bVar1);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_40,(AssertionResult *)"sut.postConditionWasCalled",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x60,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled)
{
  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_FALSE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);
}